

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O1

void __thiscall serial::Serial::flushInput(Serial *this)

{
  SerialImpl *this_00;
  
  this_00 = this->pimpl_;
  SerialImpl::readLock(this_00);
  SerialImpl::flushInput(this->pimpl_);
  SerialImpl::readUnlock(this_00);
  return;
}

Assistant:

void Serial::flushInput ()
{
  ScopedReadLock lock(this->pimpl_);
  pimpl_->flushInput ();
}